

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_exit_tb(DisasContext_conflict2 *s)

{
  TCGContext_conflict2 *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  update_cc_op(s);
  tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(QREG_PC + (long)tcg_ctx),(long)(int)s->pc);
  (s->base).is_jmp = DISAS_TARGET_1;
  return;
}

Assistant:

static void gen_exit_tb(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    update_cc_op(s);
    tcg_gen_movi_i32(tcg_ctx, QREG_PC, s->pc);
    s->base.is_jmp = DISAS_EXIT;
}